

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::CFactory::getDisplayName
          (CFactory *this,UnicodeString *id,Locale *locale,UnicodeString *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  undefined4 extraout_var_00;
  UErrorCode status;
  Locale loc;
  Locale local_110;
  
  if (((this->super_LocaleKeyFactory)._coverage & 1) == 0) {
    iVar2 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[8])
                      ();
    bVar1 = true;
    if (((undefined8 *)CONCAT44(extraout_var,iVar2) != (undefined8 *)0x0) &&
       (pvVar3 = uhash_get_63(*(UHashtable **)CONCAT44(extraout_var,iVar2),id),
       pvVar3 != (void *)0x0)) {
      Locale::Locale(&local_110);
      LocaleUtility::initLocaleFromName(id,&local_110);
      iVar2 = (*(this->_delegate->super_UObject)._vptr_UObject[5])
                        (this->_delegate,&local_110,locale,result);
      locale = (Locale *)CONCAT44(extraout_var_00,iVar2);
      Locale::~Locale(&local_110);
      bVar1 = false;
    }
    if (!bVar1) {
      return (UnicodeString *)locale;
    }
  }
  UnicodeString::setToBogus(result);
  return result;
}

Assistant:

UnicodeString&
CFactory::getDisplayName(const UnicodeString& id, const Locale& locale, UnicodeString& result) const 
{
    if ((_coverage & 0x1) == 0) {
        UErrorCode status = U_ZERO_ERROR;
        const Hashtable* ids = getSupportedIDs(status);
        if (ids && (ids->get(id) != NULL)) {
            Locale loc;
            LocaleUtility::initLocaleFromName(id, loc);
            return _delegate->getDisplayName(loc, locale, result);
        }
    }
    result.setToBogus();
    return result;
}